

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O2

void __thiscall gmlc::networking::TcpServer::~TcpServer(TcpServer *this)

{
  int in_ESI;
  
  close(this,in_ESI);
  std::
  vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  ::~vector(&this->connections);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->logFunction);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->errorCall);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->dataCall);
  std::
  _Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
  ::~_Vector_base(&(this->endpoints).
                   super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
                 );
  std::
  vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  ::~vector(&this->acceptors);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->socket_factory).super_enable_shared_from_this<gmlc::networking::SocketFactory>.
              _M_weak_this.
              super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<gmlc::networking::TcpServer>)._M_weak_this.
              super___weak_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return;
}

Assistant:

TcpServer::~TcpServer()
{
    try {
        close();
    }
    catch (...) {
    }
}